

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall pbrt::Array2D<pbrt::SPPMPixel>::~Array2D(Array2D<pbrt::SPPMPixel> *this)

{
  memory_resource *pmVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  pmVar1 = (this->allocator).memoryResource;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar3 = vpsubd_avx(auVar2,auVar3);
  auVar2 = vpshufd_avx(auVar3,0x55);
  auVar2 = vpmulld_avx(auVar2,auVar3);
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->values,(long)auVar2._0_4_ * 0xa0,8);
  return;
}

Assistant:

~Array2D() {
        int n = extent.Area();
        for (int i = 0; i < n; ++i)
            allocator.destroy(values + i);
        allocator.deallocate_object(values, n);
    }